

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

uint32_t Select_SSE2(uint32_t a,uint32_t b,uint32_t c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i BC0;
  __m128i CA0;
  __m128i AC0;
  __m128i C0;
  __m128i B0;
  __m128i A0;
  __m128i zero;
  int pa_minus_pb;
  uint32_t local_29c;
  ulong local_238;
  ulong local_228;
  ulong local_218;
  ulong local_208;
  byte local_188;
  byte bStack_187;
  byte bStack_186;
  byte bStack_185;
  byte local_168;
  byte bStack_167;
  byte bStack_166;
  byte bStack_165;
  ulong local_158;
  ulong local_138;
  ulong local_118;
  int16_t out [8];
  __m128i diff;
  __m128i pb;
  __m128i pa;
  __m128i BC;
  __m128i AC;
  __m128i CB0;
  
  local_118 = CONCAT44(0,in_EDI);
  local_138 = CONCAT44(0,in_ESI);
  local_158 = CONCAT44(0,in_EDX);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_118;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_158;
  auVar5 = psubusb(auVar4,auVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_158;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_118;
  auVar6 = psubusb(auVar3,auVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_138;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_158;
  auVar7 = psubusb(auVar2,auVar7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_158;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_138;
  auVar8 = psubusb(auVar1,auVar8);
  local_208 = auVar5._0_8_;
  local_218 = auVar6._0_8_;
  local_208 = local_208 | local_218;
  local_228 = auVar7._0_8_;
  local_238 = auVar8._0_8_;
  local_228 = local_228 | local_238;
  local_168 = (byte)local_208;
  bStack_167 = (byte)(local_208 >> 8);
  bStack_166 = (byte)(local_208 >> 0x10);
  bStack_165 = (byte)(local_208 >> 0x18);
  local_188 = (byte)local_228;
  bStack_187 = (byte)(local_228 >> 8);
  bStack_186 = (byte)(local_228 >> 0x10);
  bStack_185 = (byte)(local_228 >> 0x18);
  BC[1]._3_1_ = 0;
  BC[1]._2_1_ = bStack_187;
  BC[1]._5_1_ = 0;
  BC[1]._4_1_ = bStack_186;
  BC[1]._7_1_ = 0;
  BC[1]._6_1_ = bStack_185;
  pa[1]._3_1_ = 0;
  pa[1]._2_1_ = bStack_167;
  pa[1]._5_1_ = 0;
  pa[1]._4_1_ = bStack_166;
  pa[1]._7_1_ = 0;
  pa[1]._6_1_ = bStack_165;
  local_29c = in_ESI;
  if ((int)(short)((ushort)local_188 - (ushort)local_168) + (int)(short)(BC[1]._2_2_ - pa[1]._2_2_)
      + (int)(short)(BC[1]._4_2_ - pa[1]._4_2_) + (int)(short)(BC[1]._6_2_ - pa[1]._6_2_) < 1) {
    local_29c = in_EDI;
  }
  return local_29c;
}

Assistant:

static WEBP_INLINE uint32_t Select_SSE2(uint32_t a, uint32_t b, uint32_t c) {
  int pa_minus_pb;
  const __m128i zero = _mm_setzero_si128();
  const __m128i A0 = _mm_cvtsi32_si128((int)a);
  const __m128i B0 = _mm_cvtsi32_si128((int)b);
  const __m128i C0 = _mm_cvtsi32_si128((int)c);
  const __m128i AC0 = _mm_subs_epu8(A0, C0);
  const __m128i CA0 = _mm_subs_epu8(C0, A0);
  const __m128i BC0 = _mm_subs_epu8(B0, C0);
  const __m128i CB0 = _mm_subs_epu8(C0, B0);
  const __m128i AC = _mm_or_si128(AC0, CA0);
  const __m128i BC = _mm_or_si128(BC0, CB0);
  const __m128i pa = _mm_unpacklo_epi8(AC, zero);  // |a - c|
  const __m128i pb = _mm_unpacklo_epi8(BC, zero);  // |b - c|
  const __m128i diff = _mm_sub_epi16(pb, pa);
  {
    int16_t out[8];
    _mm_storeu_si128((__m128i*)out, diff);
    pa_minus_pb = out[0] + out[1] + out[2] + out[3];
  }
  return (pa_minus_pb <= 0) ? a : b;
}